

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_int64 sqlite3_uri_int64(char *zFilename,char *zParam,sqlite3_int64 bDflt)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  undefined1 *in_RDX;
  i64 *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *z;
  sqlite3_int64 v;
  char *in_stack_ffffffffffffffc8;
  undefined1 *local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = sqlite3_uri_parameter(in_stack_ffffffffffffffc8,(char *)0x1515e4);
  local_28 = in_RDX;
  if (pcVar3 != (char *)0x0) {
    iVar2 = sqlite3DecOrHexToI64(in_RDI,in_RSI);
    if (iVar2 == 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (sqlite3_int64)local_28;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API sqlite3_int64 sqlite3_uri_int64(
  const char *zFilename,    /* Filename as passed to xOpen */
  const char *zParam,       /* URI parameter sought */
  sqlite3_int64 bDflt       /* return if parameter is missing */
){
  const char *z = sqlite3_uri_parameter(zFilename, zParam);
  sqlite3_int64 v;
  if( z && sqlite3DecOrHexToI64(z, &v)==0 ){
    bDflt = v;
  }
  return bDflt;
}